

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O0

deInt64 deFile_getSize(deFile *file)

{
  __off_t __offset;
  deInt64 curPos;
  deInt64 size;
  deFile *file_local;
  
  __offset = lseek(file->fd,0,1);
  if (__offset < 0) {
    file_local = (deFile *)0xffffffffffffffff;
  }
  else {
    file_local = (deFile *)lseek(file->fd,0,2);
    if ((long)file_local < 0) {
      file_local = (deFile *)0xffffffffffffffff;
    }
    else {
      lseek(file->fd,__offset,0);
    }
  }
  return (deInt64)file_local;
}

Assistant:

deInt64 deFile_getSize (const deFile* file)
{
	deInt64 size	= 0;
	deInt64 curPos	= lseek(file->fd, 0, SEEK_CUR);

	if (curPos < 0)
		return -1;

	size = lseek(file->fd, 0, SEEK_END);

	if (size < 0)
		return -1;

	lseek(file->fd, (off_t)curPos, SEEK_SET);

	return size;
}